

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeShape.cpp
# Opt level: O0

void __thiscall btConeShape::btConeShape(btConeShape *this,btScalar radius,btScalar height)

{
  float fVar1;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  btScalar bVar2;
  undefined4 in_XMM1_Da;
  btVector3 halfExtents;
  btConeShape *in_stack_ffffffffffffffd0;
  btConvexInternalShape *in_stack_ffffffffffffffe0;
  
  btConvexInternalShape::btConvexInternalShape(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__btConeShape_002e4370;
  *(undefined4 *)(in_RDI + 9) = in_XMM0_Da;
  *(undefined4 *)((long)in_RDI + 0x4c) = in_XMM1_Da;
  *(undefined4 *)(in_RDI + 1) = 0xb;
  setConeUpIndex(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  btVector3::btVector3((btVector3 *)&stack0xffffffffffffffd4);
  fVar1 = *(float *)(in_RDI + 9);
  bVar2 = btSqrt(0.0);
  *(float *)((long)in_RDI + 0x44) = fVar1 / bVar2;
  return;
}

Assistant:

btConeShape::btConeShape (btScalar radius,btScalar height): btConvexInternalShape (),
m_radius (radius),
m_height(height)
{
	m_shapeType = CONE_SHAPE_PROXYTYPE;
	setConeUpIndex(1);
	btVector3 halfExtents;
	m_sinAngle = (m_radius / btSqrt(m_radius * m_radius + m_height * m_height));
}